

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

void ggml::cpu::aarch64::gemm<block_q4_0,8l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  float *pfVar8;
  int j;
  int iVar9;
  long lVar10;
  ulong uVar11;
  float *pfVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong local_f0;
  float *local_e0;
  ulong *local_d0;
  undefined8 local_78 [9];
  
  if (3 < nr) {
    iVar9 = n + 0x1f;
    if (-1 < n) {
      iVar9 = n;
    }
    iVar6 = nc + 3;
    if (-1 < nc) {
      iVar6 = nc;
    }
    local_f0 = 0;
    auVar13[8] = 0xf0;
    auVar13._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar13[9] = 0xf0;
    auVar13[10] = 0xf0;
    auVar13[0xb] = 0xf0;
    auVar13[0xc] = 0xf0;
    auVar13[0xd] = 0xf0;
    auVar13[0xe] = 0xf0;
    auVar13[0xf] = 0xf0;
    local_e0 = s;
    do {
      if (3 < nc) {
        lVar7 = local_f0 * (long)(iVar9 >> 5);
        uVar11 = 0;
        pfVar12 = local_e0;
        local_d0 = (ulong *)((long)vx + 8);
        do {
          local_78[0] = 0;
          local_78[1] = 0;
          local_78[2] = 0;
          local_78[3] = 0;
          local_78[4] = 0;
          local_78[5] = 0;
          local_78[6] = 0;
          local_78[7] = 0;
          if (0x1f < n) {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)((long)vy + lVar7 * 0x88 + 0x48);
            auVar3 = vpmovsxbd_avx2(auVar1);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)((long)vy + lVar7 * 0x88 + 8);
            vpmovsxbd_avx2(auVar2);
            auVar14._8_8_ = 0;
            auVar14._0_8_ = *local_d0;
            auVar13 = vpand_avx(auVar14,auVar13);
            auVar4 = vpmovsxbd_avx2(auVar13);
            vpmulld_avx2(auVar3,auVar4);
            halt_baddata();
          }
          lVar10 = 0;
          pfVar8 = pfVar12;
          do {
            uVar5 = *(undefined8 *)((long)local_78 + lVar10 + 8);
            *(undefined8 *)pfVar8 = *(undefined8 *)((long)local_78 + lVar10);
            *(undefined8 *)(pfVar8 + 2) = uVar5;
            lVar10 = lVar10 + 0x10;
            pfVar8 = pfVar8 + bs;
          } while (lVar10 != 0x40);
          uVar11 = uVar11 + 1;
          local_d0 = local_d0 + (long)(iVar9 >> 5) * 9;
          pfVar12 = pfVar12 + 4;
        } while (uVar11 != (uint)(iVar6 >> 2));
      }
      local_f0 = local_f0 + 1;
      local_e0 = local_e0 + bs * 4;
    } while (local_f0 != (uint)nr >> 2);
  }
  return;
}

Assistant:

void gemm<block_q4_0, 8, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemm_q4_0_4x8_q8_0(n, s, bs, vx, vy, nr, nc);
}